

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_plain
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  csubstr sp;
  csubstr sp_00;
  bool bVar1;
  error_flags eVar2;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  csubstr sub_1;
  size_t lv;
  csubstr sub;
  char curr;
  size_t i;
  size_t pos;
  undefined4 in_stack_fffffffffffffebc;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  error_flags in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  error_flags in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  error_flags in_stack_fffffffffffffee4;
  ulong local_e8;
  char *local_b8;
  char *local_b0;
  long local_98;
  char *local_90;
  char *local_88;
  undefined4 local_80;
  char *local_78;
  long *local_70;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  char *local_20;
  long *local_18;
  
  local_b0 = (char *)0x0;
  local_98 = in_RSI;
  local_90 = in_RDX;
  for (local_b8 = (char *)0x0; local_b8 < local_90; local_b8 = local_b8 + 1) {
    if (local_b8[local_98] == '\n') {
      local_28 = local_b8 + 1;
      local_18 = &local_98;
      local_20 = local_b0;
      if (local_90 < local_b0) {
        in_stack_fffffffffffffee4 = get_error_flags();
        if ((in_stack_fffffffffffffee4 & 1) != 0) {
          bVar1 = is_debugger_attached();
          in_stack_fffffffffffffee0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee0);
          if (bVar1) {
            trap_instruction();
          }
        }
        local_38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_30 = 0x1544;
        handle_error(0x3fa1ef,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
      }
      in_stack_fffffffffffffed8 = local_90;
      if (local_28 != (char *)0xffffffffffffffff) {
        in_stack_fffffffffffffed8 = local_28;
      }
      local_28 = in_stack_fffffffffffffed8;
      if (in_stack_fffffffffffffed8 < local_20) {
        in_stack_fffffffffffffed4 = get_error_flags();
        if ((in_stack_fffffffffffffed4 & 1) != 0) {
          bVar1 = is_debugger_attached();
          in_stack_fffffffffffffed0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed0);
          if (bVar1) {
            trap_instruction();
          }
        }
        local_48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_40 = 0x1546;
        handle_error(0x3fa1ef,(char *)0x1546,"check failed: %s","first <= last");
      }
      if (local_90 < local_28) {
        in_stack_fffffffffffffecc = get_error_flags();
        if ((in_stack_fffffffffffffecc & 1) != 0) {
          bVar1 = is_debugger_attached();
          in_stack_fffffffffffffec8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec8);
          if (bVar1) {
            trap_instruction();
          }
        }
        local_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_50 = 0x1547;
        handle_error(0x3fa1ef,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      sp.str._4_4_ = in_stack_fffffffffffffed4;
      sp.str._0_4_ = in_stack_fffffffffffffed0;
      sp.len = (size_t)in_stack_fffffffffffffed8;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),sp);
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffec0,(char)((uint)in_stack_fffffffffffffebc >> 0x18));
      if (local_b8 + 1 < local_90) {
        for (local_e8 = 0; local_e8 < in_RCX + 1U; local_e8 = local_e8 + 1) {
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffec0,(char)((uint)in_stack_fffffffffffffebc >> 0x18));
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffec0,(char)((uint)in_stack_fffffffffffffebc >> 0x18));
        }
      }
      local_b0 = local_b8 + 1;
    }
  }
  if (local_b0 < local_90) {
    local_70 = &local_98;
    local_78 = local_b0;
    if (local_90 < local_b0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_80 = 0x1533;
      handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    sp_00.str._4_4_ = in_stack_fffffffffffffed4;
    sp_00.str._0_4_ = in_stack_fffffffffffffed0;
    sp_00.len = (size_t)in_stack_fffffffffffffed8;
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),sp_00);
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_plain(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
}